

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseCurrentNode
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  bool bVar3;
  long lVar4;
  unsigned_long *puVar5;
  
  puVar1 = this->P;
  lVar4 = 0;
  puVar5 = puVar1;
  while( true ) {
    if (*puVar5 == 0) {
      return;
    }
    if (*puVar5 == 0x3c) break;
    puVar5 = puVar5 + 1;
    this->P = puVar5;
    lVar4 = lVar4 + 8;
  }
  if (0 < lVar4) {
    bVar3 = setText(this,puVar1,puVar5);
    if (bVar3) {
      return;
    }
    puVar5 = this->P;
  }
  this->P = puVar5 + 1;
  uVar2 = puVar5[1];
  if (uVar2 == 0x21) {
    bVar3 = parseCDATA(this);
    if (bVar3) {
      return;
    }
    parseComment(this);
    return;
  }
  if (uVar2 == 0x3f) {
    this->CurrentNodeType = EXN_UNKNOWN;
    if (puVar5[1] != 0x3e) {
      puVar1 = puVar5 + 2;
      do {
        puVar5 = puVar1;
        this->P = puVar5;
        puVar1 = puVar5 + 1;
      } while (*puVar5 != 0x3e);
      puVar5 = puVar5 + -1;
    }
    this->P = puVar5 + 2;
    return;
  }
  if (uVar2 != 0x2f) {
    parseOpeningXMLElement(this);
    return;
  }
  parseClosingXMLElement(this);
  return;
}

Assistant:

void parseCurrentNode()
	{
		char_type* start = P;

		// move forward until '<' found
		while(*P != L'<' && *P)
			++P;

		if (!*P)
			return;

		if (P - start > 0)
		{
			// we found some text, store it
			if (setText(start, P))
				return;
		}

		++P;

		// based on current token, parse and report next element
		switch(*P)
		{
		case L'/':
			parseClosingXMLElement(); 
			break;
		case L'?':
			ignoreDefinition();	
			break;
		case L'!':
			if (!parseCDATA())
				parseComment();	
			break;
		default:
			parseOpeningXMLElement();
			break;
		}
	}